

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

void __thiscall icu_63::UnifiedCache::handleUnreferencedObject(UnifiedCache *this)

{
  umtx_lock_63(&gCacheMutex);
  this->fNumValuesInUse = this->fNumValuesInUse + -1;
  _runEvictionSlice(this);
  umtx_unlock_63(&gCacheMutex);
  return;
}

Assistant:

void UnifiedCache::handleUnreferencedObject() const {
    Mutex lock(&gCacheMutex);
    --fNumValuesInUse;
    _runEvictionSlice();
}